

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

bool __thiscall
el::base::RegisteredHitCounters::validateEveryN
          (RegisteredHitCounters *this,char *filename,LineNumber lineNumber,size_t n)

{
  undefined1 auVar1 [16];
  HitCounter *pHVar2;
  ulong uVar3;
  size_t sVar4;
  bool bVar5;
  char *local_28;
  
  local_28 = filename;
  (*(this->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
    super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
    .super_ThreadSafe._vptr_ThreadSafe[2])();
  pHVar2 = utils::RegistryWithPred<el::base::HitCounter,el::base::HitCounter::Predicate>::
           get<char_const*,unsigned_long>
                     ((RegistryWithPred<el::base::HitCounter,el::base::HitCounter::Predicate> *)this
                      ,&local_28,lineNumber);
  if (pHVar2 == (HitCounter *)0x0) {
    pHVar2 = (HitCounter *)operator_new(0x20);
    pHVar2->_vptr_HitCounter = (_func_int **)&PTR__HitCounter_001948e0;
    pHVar2->m_filename = local_28;
    pHVar2->m_lineNumber = lineNumber;
    pHVar2->m_hitCounts = 0;
    (*(this->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
      super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
      .super_ThreadSafe._vptr_ThreadSafe[0x10])(this,pHVar2);
  }
  if (99999 < pHVar2->m_hitCounts) {
    if (n == 0) {
      sVar4 = 0;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = n;
      sVar4 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(100000)) % auVar1,0);
    }
    pHVar2->m_hitCounts = sVar4;
  }
  uVar3 = pHVar2->m_hitCounts + 1;
  pHVar2->m_hitCounts = uVar3;
  bVar5 = false;
  if ((n != 0) && (bVar5 = false, uVar3 != 0)) {
    bVar5 = uVar3 % n == 0;
  }
  return bVar5;
}

Assistant:

bool RegisteredHitCounters::validateEveryN(const char* filename, base::type::LineNumber lineNumber, std::size_t n) {
  base::threading::ScopedLock scopedLock(lock());
  base::HitCounter* counter = get(filename, lineNumber);
  if (counter == nullptr) {
    registerNew(counter = new base::HitCounter(filename, lineNumber));
  }
  counter->validateHitCounts(n);
  bool result = (n >= 1 && counter->hitCounts() != 0 && counter->hitCounts() % n == 0);
  return result;
}